

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O0

int CheckV2MVersion(uchar *inptr,int inlen,ssbase *base)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  int local_cec;
  int ret;
  int d;
  int p_1;
  int best;
  int matches;
  uint32_t *poffsets;
  int pcp;
  uint8_t *ptr;
  int td;
  int nn;
  int nt;
  int np;
  int pcn;
  int pct;
  undefined1 local_c98 [2];
  uchar v;
  uchar p;
  int ch;
  undefined4 local_238 [2];
  int patchesused [128];
  int local_2c;
  int i;
  ssbase *base_local;
  int inlen_local;
  uchar *inptr_local;
  
  readfile((ssbase *)local_c98,inptr,inlen);
  memcpy(base,local_c98,0xa60);
  if (base->patchsize == 0) {
    inptr_local._4_4_ = -1;
  }
  else {
    memset(local_238,0,0x200);
    base->maxp = 0;
    for (pct = 0; pct < 0x10; pct = pct + 1) {
      pcn._3_1_ = 0;
      np = 0;
      uVar1 = base->chan[pct].pcnum;
      nn = 0;
      td = 0;
      uVar2 = base->chan[pct].notenum;
      for (poffsets._4_4_ = 0; poffsets._4_4_ < (int)uVar1; poffsets._4_4_ = poffsets._4_4_ + 1) {
        puVar3 = base->chan[pct].pcptr;
        np = (uint)puVar3[(int)(uVar1 * 2 + poffsets._4_4_)] * 0x10000 +
             (uint)puVar3[(int)(uVar1 + poffsets._4_4_)] * 0x100 + (uint)puVar3[poffsets._4_4_] + np
        ;
        if ((td < np) && (patchesused[(ulong)pcn._3_1_ - 2] = 1, base->maxp <= (int)(uint)pcn._3_1_)
           ) {
          base->maxp = pcn._3_1_ + 1;
        }
        pcn._3_1_ = pcn._3_1_ + puVar3[(int)(uVar1 * 3 + poffsets._4_4_)];
        for (; nn < (int)uVar2 && td <= np; nn = nn + 1) {
          puVar3 = base->chan[pct].noteptr;
          td = (uint)puVar3[(int)(uVar2 * 2 + nn)] * 0x10000 +
               (uint)puVar3[(int)(uVar2 + nn)] * 0x100 + (uint)puVar3[nn] + td;
        }
      }
      if ((nn < (int)uVar2) &&
         (patchesused[(ulong)pcn._3_1_ - 2] = 1, base->maxp <= (int)(uint)pcn._3_1_)) {
        base->maxp = pcn._3_1_ + 1;
      }
    }
    if (base->maxp == 0) {
      inptr_local._4_4_ = -1;
    }
    else {
      puVar3 = base->patchmap;
      p_1 = 0;
      d = -1;
      for (local_2c = 0; local_2c <= v2version; local_2c = local_2c + 1) {
        if (base->globsize == v2gsizes[local_2c]) {
          ret = 0;
          while (((ret < base->maxp + -1 &&
                  (iVar4 = (*(int *)(puVar3 + (long)(ret + 1) * 4) -
                           *(int *)(puVar3 + (long)ret * 4)) - (v2vsizes[local_2c] + -0x2fd),
                  iVar4 % 3 == 0)) &&
                 (iVar4 / 3 ==
                  (uint)base->patchmap
                        [(*(int *)(puVar3 + (long)ret * 4) + v2vsizes[local_2c]) - 0x2fe]))) {
            ret = ret + 1;
          }
          if (ret == base->maxp + -1) {
            d = local_2c;
            p_1 = p_1 + 1;
          }
        }
      }
      if (p_1 < 1) {
        local_cec = -2;
      }
      else {
        local_cec = v2version - d;
      }
      inptr_local._4_4_ = local_cec;
    }
  }
  return inptr_local._4_4_;
}

Assistant:

int CheckV2MVersion(const unsigned char *inptr, const int inlen, ssbase& base)
{
    int i;
    int patchesused[128];
    base = readfile(inptr,inlen);

    if (!base.patchsize)
        return -1;

    // determine highest used patch from progchange commands
    // (midiconv remaps the patches so that they're a
    //  continuous block from 0 to x)
    memset(patchesused, 0, sizeof(patchesused));
    base.maxp = 0;


    for (int ch = 0; ch < 16; ch++)
    {
        unsigned char p = 0;
        unsigned char v = 0;

        //int pcp = 0;
        int pct = 0;
        int pcn = base.chan[ch].pcnum;
        int np = 0;
        int nt = 0;
        int nn = base.chan[ch].notenum;

        int td;
        const uint8_t *ptr;
        for (int pcp = 0; pcp < pcn; pcp++)
        {
            // have there been notes? add last pgm
            ptr = base.chan[ch].pcptr;
            td  = 0x10000*ptr[2*pcn + pcp] + 0x100*ptr[1*pcn + pcp] + ptr[0*pcn + pcp];
            pct += td;
            if (pct > nt)
            {
                patchesused[p] = 1;
                if (p >= base.maxp) base.maxp = p + 1;
            }
            p += ptr[3*pcn + pcp];

            // walk notes until we reach current cmd
            while (np < nn && nt <= pct)
            {
                ptr = base.chan[ch].noteptr;
                td  = 0x10000*ptr[2*nn + np] + 0x100*ptr[1*nn + np] + ptr[0*nn + np];
                v  += ptr[4*nn+np];
                nt += td;
                np++;
            }
        }

        if (np < nn)
        {
            patchesused[p] = 1;
            if (p >= base.maxp) base.maxp = p + 1;
        }

    }
    printf2("patches used: %d\n", base.maxp);

    if (!base.maxp)
        return -1;

    // offset table to ptaches
    uint32_t *poffsets = (uint32_t *)base.patchmap;

    int matches = 0, best = -1;
    // for each version check...
    for (i = 0; i <= v2version; i++)
    {
        // ... if globals size is correct...
        if (base.globsize == v2gsizes[i])
        {
            printf2("globsize match: %d\n",i);
            // ... and if the size of all patches makes sense
            int p;
            for (p = 0; p < base.maxp - 1; p++)
            {
                int d = (poffsets[p + 1] - poffsets[p]) - (v2vsizes[i] - 3*255);
                if (d % 3) break;
                d /= 3;
                if (d != base.patchmap[poffsets[p] + v2vsizes[i] - 3*255 - 1])
                    break;
            }

            if (p == base.maxp - 1)
            {
                printf2("... ok!\n");
                best = i;
                matches++;
            } else
            {
                printf2("no match!\n");
            }
        }
    }

    // if we've got exactly one match, we're quite sure
    int ret = (matches >= 1) ? v2version - best : -2;
    printf2("found version delta: %d\n", ret);
    return ret;
}